

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::ListBoxHeader(char *label,int items_count,int height_in_items)

{
  float fVar1;
  float fVar2;
  bool bVar3;
  int iVar4;
  ImGuiStyle *pIVar5;
  float fVar6;
  ImVec2 local_18;
  
  iVar4 = 7;
  if (items_count < 7) {
    iVar4 = items_count;
  }
  if (-1 < height_in_items) {
    iVar4 = height_in_items;
  }
  fVar6 = (float)iVar4;
  if (iVar4 < items_count) {
    fVar6 = fVar6 + 0.4;
  }
  local_18.x = 0.0;
  fVar1 = GImGui->FontSize;
  fVar2 = (GImGui->Style).ItemSpacing.y;
  pIVar5 = GetStyle();
  local_18.y = (fVar1 + fVar2) * fVar6 + (pIVar5->ItemSpacing).y;
  bVar3 = ListBoxHeader(label,&local_18);
  return bVar3;
}

Assistant:

bool ImGui::ListBoxHeader(const char* label, int items_count, int height_in_items)
{
    // Size default to hold ~7 items. Fractional number of items helps seeing that we can scroll down/up without looking at scrollbar.
    // We don't add +0.40f if items_count <= height_in_items. It is slightly dodgy, because it means a dynamic list of items will make the widget resize occasionally when it crosses that size.
    // I am expecting that someone will come and complain about this behavior in a remote future, then we can advise on a better solution.
    if (height_in_items < 0)
        height_in_items = ImMin(items_count, 7);
    float height_in_items_f = height_in_items < items_count ? (height_in_items + 0.40f) : (height_in_items + 0.00f);

    // We include ItemSpacing.y so that a list sized for the exact number of items doesn't make a scrollbar appears. We could also enforce that by passing a flag to BeginChild().
    ImVec2 size;
    size.x = 0.0f;
    size.y = GetTextLineHeightWithSpacing() * height_in_items_f + GetStyle().ItemSpacing.y;
    return ListBoxHeader(label, size);
}